

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_diag_sse2_128_16.c
# Opt level: O2

parasail_result_t *
parasail_nw_table_diag_sse2_128_16
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  int *piVar1;
  int *piVar2;
  short sVar3;
  bool bVar4;
  bool bVar5;
  short sVar6;
  short sVar7;
  bool bVar8;
  short sVar9;
  bool bVar10;
  short sVar11;
  bool bVar12;
  short sVar13;
  undefined1 auVar14 [16];
  unkbyte10 Var15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  int iVar19;
  int iVar20;
  parasail_result_t *ppVar21;
  int16_t *ptr;
  int16_t *ptr_00;
  int16_t *ptr_01;
  long lVar22;
  int iVar23;
  uint uVar24;
  uint uVar25;
  ulong uVar26;
  char *pcVar27;
  int iVar28;
  uint uVar29;
  long lVar30;
  char *__format;
  uint uVar31;
  uint uVar32;
  ulong uVar33;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  int16_t iVar37;
  uint uVar38;
  uint uVar39;
  ulong uVar40;
  ulong uVar41;
  bool bVar42;
  ushort uVar43;
  undefined4 uVar44;
  undefined4 uVar45;
  ushort uVar48;
  ushort uVar49;
  ushort uVar50;
  ushort uVar51;
  ushort uVar52;
  ushort uVar53;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  ushort uVar54;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  short sVar61;
  undefined1 auVar62 [16];
  undefined4 uVar63;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  __m128i vNWH;
  undefined1 auVar76 [16];
  uint local_248;
  short local_238;
  short sStack_236;
  int16_t *local_220;
  undefined1 local_1d8 [16];
  ulong local_1c8;
  ulong local_1c0;
  ulong local_1b8;
  ulong local_1b0;
  ulong local_1a8;
  ulong local_1a0;
  long local_198;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined1 local_168 [16];
  short local_c8;
  short sStack_c6;
  undefined8 uStack_c0;
  undefined8 local_b8;
  ulong uStack_b0;
  short local_98;
  short sStack_96;
  short sStack_94;
  short sStack_92;
  short sStack_90;
  short sStack_8e;
  short sStack_8c;
  short sStack_8a;
  short local_78;
  short sStack_76;
  short sStack_74;
  short sStack_72;
  short sStack_70;
  short sStack_6e;
  short sStack_6c;
  short sStack_6a;
  short sVar55;
  short sVar60;
  
  if (_s2 == (char *)0x0) {
    __format = "%s: missing %s\n";
    pcVar27 = "_s2";
  }
  else {
    uVar41 = (ulong)(uint)s2Len;
    if (s2Len < 1) {
      __format = "%s: %s must be > 0\n";
      pcVar27 = "s2Len";
    }
    else if (open < 0) {
      __format = "%s: %s must be >= 0\n";
      pcVar27 = "open";
    }
    else if (gap < 0) {
      __format = "%s: %s must be >= 0\n";
      pcVar27 = "gap";
    }
    else if (matrix == (parasail_matrix_t *)0x0) {
      __format = "%s: missing %s\n";
      pcVar27 = "matrix";
    }
    else {
      if (matrix->type != 0) {
        uVar26 = (ulong)(uint)matrix->length;
LAB_00559b86:
        iVar23 = -open;
        iVar28 = matrix->min;
        iVar20 = -iVar28;
        if (iVar28 != iVar23 && SBORROW4(iVar28,iVar23) == iVar28 + open < 0) {
          iVar20 = open;
        }
        iVar19 = matrix->max;
        uVar36 = (uint)uVar26;
        ppVar21 = parasail_result_new_table1(uVar36,s2Len);
        if (ppVar21 != (parasail_result_t *)0x0) {
          ppVar21->flag = ppVar21->flag | 0x8221001;
          uVar33 = (ulong)(s2Len + 0xe);
          ptr = parasail_memalign_int16_t(0x10,uVar33);
          ptr_00 = parasail_memalign_int16_t(0x10,uVar33);
          ptr_01 = parasail_memalign_int16_t(0x10,uVar33);
          if (ptr_01 != (int16_t *)0x0 && (ptr_00 != (int16_t *)0x0 && ptr != (int16_t *)0x0)) {
            lVar30 = (long)(int)uVar36;
            if (matrix->type == 0) {
              local_220 = parasail_memalign_int16_t(0x10,(long)(int)(uVar36 + 7));
              uVar33 = 0;
              if (local_220 == (int16_t *)0x0) {
                return (parasail_result_t *)0x0;
              }
              uVar40 = 0;
              if (0 < (int)uVar36) {
                uVar40 = uVar26;
              }
              for (; lVar22 = lVar30, uVar40 != uVar33; uVar33 = uVar33 + 1) {
                local_220[uVar33] = (int16_t)matrix->mapper[(byte)_s1[uVar33]];
              }
              for (; lVar22 < (int)(uVar36 + 7); lVar22 = lVar22 + 1) {
                local_220[lVar22] = 0;
              }
            }
            else {
              local_220 = (int16_t *)0x0;
            }
            auVar46 = ZEXT416(CONCAT22((short)((uint)iVar28 >> 0x10),0x7ffe - (short)iVar19));
            uVar35 = s2Len + 7;
            local_248 = uVar36 - 1;
            iVar28 = s2Len + -1;
            uVar38 = iVar20 - 0x7fff;
            auVar64 = pshuflw(ZEXT416(uVar38),ZEXT416(uVar38),0);
            uVar63 = auVar64._0_4_;
            local_238 = auVar64._0_2_;
            sStack_236 = auVar64._2_2_;
            auVar46 = pshuflw(auVar46,auVar46,0);
            uVar44 = auVar46._0_4_;
            auVar64._0_8_ = CONCAT44(uVar44,uVar44);
            auVar64._8_4_ = uVar44;
            auVar64._12_4_ = uVar44;
            auVar47 = pshuflw(auVar64,ZEXT416((uint)open),0);
            uVar44 = auVar47._0_4_;
            auVar47 = pshuflw(ZEXT416((uint)gap),ZEXT416((uint)gap),0);
            uVar45 = auVar47._0_4_;
            auVar65._4_4_ = uVar45;
            auVar65._0_4_ = uVar45;
            auVar65._8_4_ = uVar45;
            auVar65._12_4_ = uVar45;
            auVar47 = pshuflw(auVar47,ZEXT416(uVar36),0);
            uVar45 = auVar47._0_4_;
            auVar56._4_4_ = uVar45;
            auVar56._0_4_ = uVar45;
            auVar56._8_4_ = uVar45;
            auVar56._12_4_ = uVar45;
            auVar47._8_4_ = 0xffffffff;
            auVar47._0_8_ = 0xffffffffffffffff;
            auVar47._12_4_ = 0xffffffff;
            auVar56 = paddsw(auVar56,auVar47);
            auVar57 = pshuflw(ZEXT416((uint)s2Len),ZEXT416((uint)s2Len),0);
            auVar57._4_4_ = auVar57._0_4_;
            auVar57._8_4_ = auVar57._0_4_;
            auVar57._12_4_ = auVar57._0_4_;
            auVar47 = paddsw(auVar57,auVar47);
            auVar57 = psllw(auVar65,3);
            local_1d8._6_2_ = (short)(iVar23 + gap * -4);
            local_1d8._4_2_ = (short)(gap * 0xfffb - open);
            local_1d8._2_2_ = (short)(gap * 0xfffa - open);
            local_1d8._0_2_ = (short)(gap * 0xfff9 - open);
            local_1d8._10_2_ = (short)(iVar23 + gap * -2);
            local_1d8._8_2_ = (short)(gap * 0xfffd - open);
            sVar61 = (short)iVar23;
            local_1d8._14_2_ = sVar61;
            local_1d8._12_2_ = (short)(iVar23 - gap);
            piVar1 = matrix->mapper;
            for (uVar26 = 0; uVar41 != uVar26; uVar26 = uVar26 + 1) {
              ptr[uVar26 + 7] = (int16_t)piVar1[(byte)_s2[uVar26]];
            }
            for (lVar22 = 0; uVar26 = uVar41, lVar22 != 7; lVar22 = lVar22 + 1) {
              ptr[lVar22] = 0;
            }
            for (; (int)uVar26 < (int)uVar35; uVar26 = uVar26 + 1) {
              ptr[uVar26 + 7] = 0;
            }
            for (uVar26 = 0; iVar37 = (int16_t)uVar38, uVar41 != uVar26; uVar26 = uVar26 + 1) {
              ptr_00[uVar26 + 7] = (int16_t)iVar23;
              iVar23 = iVar23 - gap;
              ptr_01[uVar26 + 7] = iVar37;
            }
            for (lVar22 = 0; uVar26 = uVar41, lVar22 != 7; lVar22 = lVar22 + 1) {
              ptr_00[lVar22] = iVar37;
              ptr_01[lVar22] = iVar37;
            }
            for (; (int)uVar26 < (int)uVar35; uVar26 = uVar26 + 1) {
              ptr_00[uVar26 + 7] = iVar37;
              ptr_01[uVar26 + 7] = iVar37;
            }
            ptr_00[6] = 0;
            Var15 = CONCAT28(local_238,CONCAT26(sStack_236,CONCAT24(local_238,uVar63)));
            auVar14._10_2_ = sStack_236;
            auVar14._0_10_ = Var15;
            auVar14._12_2_ = local_238;
            auVar14._14_2_ = sStack_236;
            local_198 = 0;
            if ((int)uVar35 < 1) {
              uVar35 = 0;
            }
            lVar22 = uVar41 * 4;
            uVar26 = 0;
            uStack_c0 = auVar64._8_8_;
            uStack_170 = uStack_c0;
            auVar17._4_4_ = uVar44;
            auVar17._0_4_ = uVar44;
            auVar17._8_4_ = uVar44;
            auVar17._12_4_ = uVar44;
            auVar59 = _DAT_008a19c0;
            auVar67 = auVar14;
            local_178 = auVar64._0_8_;
            local_168 = auVar14;
            while ((long)uVar26 < lVar30) {
              if (matrix->type == 0) {
                uVar36 = (uint)local_220[uVar26];
                uVar34 = (uint)local_220[uVar26 + 1];
                uVar24 = (uint)local_220[uVar26 + 2];
                uVar29 = (uint)local_220[uVar26 + 3];
                uVar32 = (uint)local_220[uVar26 + 4];
                uVar31 = (uint)local_220[uVar26 + 5];
                uVar39 = (uint)local_220[uVar26 + 6];
                uVar25 = (int)local_220[uVar26 + 7];
              }
              else {
                uVar36 = (uint)uVar26;
                uVar34 = local_248;
                if ((long)(uVar26 | 1) < lVar30) {
                  uVar34 = uVar36 | 1;
                }
                uVar24 = uVar36 | 2;
                if (lVar30 <= (long)(uVar26 | 2)) {
                  uVar24 = local_248;
                }
                uVar29 = uVar36 | 3;
                if (lVar30 <= (long)(uVar26 | 3)) {
                  uVar29 = local_248;
                }
                uVar32 = uVar36 | 4;
                if (lVar30 <= (long)(uVar26 | 4)) {
                  uVar32 = local_248;
                }
                uVar31 = uVar36 | 5;
                if (lVar30 <= (long)(uVar26 | 5)) {
                  uVar31 = local_248;
                }
                uVar39 = uVar36 | 6;
                if (lVar30 <= (long)(uVar26 | 6)) {
                  uVar39 = local_248;
                }
                uVar25 = uVar36 | 7;
                if (lVar30 <= (long)(uVar26 | 7)) {
                  uVar25 = local_248;
                }
              }
              local_1a0 = uVar26 | 1;
              local_1a8 = uVar26 | 2;
              local_1b0 = uVar26 | 3;
              local_1b8 = uVar26 | 4;
              local_1c0 = uVar26 | 5;
              local_1c8 = uVar26 | 6;
              uVar40 = uVar26 | 7;
              piVar1 = matrix->matrix;
              iVar20 = matrix->size;
              local_b8 = (undefined8)((unkuint10)Var15 >> 0x10);
              uStack_b0 = auVar14._8_8_ >> 0x10;
              auVar76._8_8_ = uStack_b0 | (ulong)(ushort)ptr_00[6] << 0x30;
              auVar76._0_8_ = local_b8;
              auVar62._8_8_ =
                   uStack_b0 | (ulong)(ushort)(sVar61 - (short)uVar26 * (short)gap) << 0x30;
              auVar62._0_8_ = local_b8;
              uVar26 = uVar26 + 8;
              ptr_00[6] = sVar61 - (short)uVar26 * (short)gap;
              local_98 = auVar56._0_2_;
              sStack_96 = auVar56._2_2_;
              sStack_94 = auVar56._4_2_;
              sStack_92 = auVar56._6_2_;
              sStack_90 = auVar56._8_2_;
              sStack_8e = auVar56._10_2_;
              sStack_8c = auVar56._12_2_;
              sStack_8a = auVar56._14_2_;
              auVar70._4_2_ = local_238;
              auVar70._0_4_ = uVar63;
              auVar70._6_2_ = sStack_236;
              auVar70._8_2_ = local_238;
              auVar70._10_2_ = sStack_236;
              auVar70._12_2_ = local_238;
              auVar70._14_2_ = sStack_236;
              auVar64 = auVar70;
              auVar73 = _DAT_008a1b90;
              for (uVar33 = 0; uVar35 != uVar33; uVar33 = uVar33 + 1) {
                auVar74._0_8_ = auVar62._2_8_;
                auVar74._8_8_ = auVar62._8_8_ >> 0x10 | (ulong)(ushort)ptr_00[uVar33 + 7] << 0x30;
                auVar71._0_8_ = auVar64._2_8_;
                auVar71._8_8_ = auVar64._8_8_ >> 0x10 | (ulong)(ushort)ptr_01[uVar33 + 7] << 0x30;
                auVar75 = psubsw(auVar74,auVar17);
                auVar64 = psubsw(auVar71,auVar65);
                sVar3 = auVar75._0_2_;
                sVar55 = auVar64._0_2_;
                auVar72._0_2_ =
                     (ushort)(sVar55 < sVar3) * sVar3 | (ushort)(sVar55 >= sVar3) * sVar55;
                sVar3 = auVar75._2_2_;
                sVar55 = auVar64._2_2_;
                auVar72._2_2_ =
                     (ushort)(sVar55 < sVar3) * sVar3 | (ushort)(sVar55 >= sVar3) * sVar55;
                sVar3 = auVar75._4_2_;
                sVar55 = auVar64._4_2_;
                auVar72._4_2_ =
                     (ushort)(sVar55 < sVar3) * sVar3 | (ushort)(sVar55 >= sVar3) * sVar55;
                sVar3 = auVar75._6_2_;
                sVar55 = auVar64._6_2_;
                auVar72._6_2_ =
                     (ushort)(sVar55 < sVar3) * sVar3 | (ushort)(sVar55 >= sVar3) * sVar55;
                sVar3 = auVar75._8_2_;
                sVar55 = auVar64._8_2_;
                auVar72._8_2_ =
                     (ushort)(sVar55 < sVar3) * sVar3 | (ushort)(sVar55 >= sVar3) * sVar55;
                sVar3 = auVar75._10_2_;
                sVar55 = auVar64._10_2_;
                auVar72._10_2_ =
                     (ushort)(sVar55 < sVar3) * sVar3 | (ushort)(sVar55 >= sVar3) * sVar55;
                sVar3 = auVar75._12_2_;
                sVar55 = auVar64._12_2_;
                sVar60 = auVar64._14_2_;
                auVar72._12_2_ =
                     (ushort)(sVar55 < sVar3) * sVar3 | (ushort)(sVar55 >= sVar3) * sVar55;
                sVar3 = auVar75._14_2_;
                auVar72._14_2_ =
                     (ushort)(sVar60 < sVar3) * sVar3 | (ushort)(sVar60 >= sVar3) * sVar60;
                auVar62 = psubsw(auVar62,auVar17);
                auVar64 = psubsw(auVar70,auVar65);
                sVar3 = auVar62._0_2_;
                sVar55 = auVar64._0_2_;
                auVar58._0_2_ =
                     (ushort)(sVar55 < sVar3) * sVar3 | (ushort)(sVar55 >= sVar3) * sVar55;
                sVar3 = auVar62._2_2_;
                sVar55 = auVar64._2_2_;
                auVar58._2_2_ =
                     (ushort)(sVar55 < sVar3) * sVar3 | (ushort)(sVar55 >= sVar3) * sVar55;
                sVar3 = auVar62._4_2_;
                sVar55 = auVar64._4_2_;
                auVar58._4_2_ =
                     (ushort)(sVar55 < sVar3) * sVar3 | (ushort)(sVar55 >= sVar3) * sVar55;
                sVar3 = auVar62._6_2_;
                sVar55 = auVar64._6_2_;
                auVar58._6_2_ =
                     (ushort)(sVar55 < sVar3) * sVar3 | (ushort)(sVar55 >= sVar3) * sVar55;
                sVar3 = auVar62._8_2_;
                sVar55 = auVar64._8_2_;
                auVar58._8_2_ =
                     (ushort)(sVar55 < sVar3) * sVar3 | (ushort)(sVar55 >= sVar3) * sVar55;
                sVar3 = auVar62._10_2_;
                sVar55 = auVar64._10_2_;
                auVar58._10_2_ =
                     (ushort)(sVar55 < sVar3) * sVar3 | (ushort)(sVar55 >= sVar3) * sVar55;
                sVar3 = auVar62._12_2_;
                sVar55 = auVar64._12_2_;
                sVar60 = auVar64._14_2_;
                auVar58._12_2_ =
                     (ushort)(sVar55 < sVar3) * sVar3 | (ushort)(sVar55 >= sVar3) * sVar55;
                sVar3 = auVar62._14_2_;
                auVar58._14_2_ =
                     (ushort)(sVar60 < sVar3) * sVar3 | (ushort)(sVar60 >= sVar3) * sVar60;
                auVar68._14_2_ = (short)piVar1[(long)(int)(uVar36 * iVar20) + (long)ptr[uVar33 + 7]]
                ;
                auVar68._12_2_ = (short)piVar1[(long)(int)(uVar34 * iVar20) + (long)ptr[uVar33 + 6]]
                ;
                auVar68._10_2_ = (short)piVar1[(long)(int)(uVar24 * iVar20) + (long)ptr[uVar33 + 5]]
                ;
                auVar68._8_2_ = (short)piVar1[(long)(int)(uVar29 * iVar20) + (long)ptr[uVar33 + 4]];
                auVar68._6_2_ = (short)piVar1[(long)(int)(uVar32 * iVar20) + (long)ptr[uVar33 + 3]];
                auVar68._4_2_ = (short)piVar1[(long)(int)(uVar31 * iVar20) + (long)ptr[uVar33 + 2]];
                auVar68._0_2_ = (undefined2)piVar1[(long)(int)(uVar25 * iVar20) + (long)ptr[uVar33]]
                ;
                auVar68._2_2_ = (short)piVar1[(long)(int)(uVar39 * iVar20) + (long)ptr[uVar33 + 1]];
                auVar64 = paddsw(auVar76,auVar68);
                uVar43 = ((short)auVar58._0_2_ < (short)auVar72._0_2_) * auVar72._0_2_ |
                         ((short)auVar58._0_2_ >= (short)auVar72._0_2_) * auVar58._0_2_;
                uVar48 = ((short)auVar58._2_2_ < (short)auVar72._2_2_) * auVar72._2_2_ |
                         ((short)auVar58._2_2_ >= (short)auVar72._2_2_) * auVar58._2_2_;
                uVar49 = ((short)auVar58._4_2_ < (short)auVar72._4_2_) * auVar72._4_2_ |
                         ((short)auVar58._4_2_ >= (short)auVar72._4_2_) * auVar58._4_2_;
                uVar50 = ((short)auVar58._6_2_ < (short)auVar72._6_2_) * auVar72._6_2_ |
                         ((short)auVar58._6_2_ >= (short)auVar72._6_2_) * auVar58._6_2_;
                uVar51 = ((short)auVar58._8_2_ < (short)auVar72._8_2_) * auVar72._8_2_ |
                         ((short)auVar58._8_2_ >= (short)auVar72._8_2_) * auVar58._8_2_;
                uVar52 = ((short)auVar58._10_2_ < (short)auVar72._10_2_) * auVar72._10_2_ |
                         ((short)auVar58._10_2_ >= (short)auVar72._10_2_) * auVar58._10_2_;
                uVar53 = ((short)auVar58._12_2_ < (short)auVar72._12_2_) * auVar72._12_2_ |
                         ((short)auVar58._12_2_ >= (short)auVar72._12_2_) * auVar58._12_2_;
                uVar54 = ((short)auVar58._14_2_ < (short)auVar72._14_2_) * auVar72._14_2_ |
                         ((short)auVar58._14_2_ >= (short)auVar72._14_2_) * auVar58._14_2_;
                sVar3 = auVar64._0_2_;
                auVar75._0_2_ =
                     (ushort)((short)uVar43 < sVar3) * sVar3 | ((short)uVar43 >= sVar3) * uVar43;
                sVar3 = auVar64._2_2_;
                auVar75._2_2_ =
                     (ushort)((short)uVar48 < sVar3) * sVar3 | ((short)uVar48 >= sVar3) * uVar48;
                sVar3 = auVar64._4_2_;
                auVar75._4_2_ =
                     (ushort)((short)uVar49 < sVar3) * sVar3 | ((short)uVar49 >= sVar3) * uVar49;
                sVar3 = auVar64._6_2_;
                auVar75._6_2_ =
                     (ushort)((short)uVar50 < sVar3) * sVar3 | ((short)uVar50 >= sVar3) * uVar50;
                sVar3 = auVar64._8_2_;
                auVar75._8_2_ =
                     (ushort)((short)uVar51 < sVar3) * sVar3 | ((short)uVar51 >= sVar3) * uVar51;
                sVar3 = auVar64._10_2_;
                auVar75._10_2_ =
                     (ushort)((short)uVar52 < sVar3) * sVar3 | ((short)uVar52 >= sVar3) * uVar52;
                sVar3 = auVar64._12_2_;
                auVar75._12_2_ =
                     (ushort)((short)uVar53 < sVar3) * sVar3 | ((short)uVar53 >= sVar3) * uVar53;
                sVar3 = auVar64._14_2_;
                auVar75._14_2_ =
                     (ushort)((short)uVar54 < sVar3) * sVar3 | ((short)uVar54 >= sVar3) * uVar54;
                auVar69._0_2_ = -(ushort)(auVar73._0_2_ == -1);
                auVar69._2_2_ = -(ushort)(auVar73._2_2_ == -1);
                auVar69._4_2_ = -(ushort)(auVar73._4_2_ == -1);
                auVar69._6_2_ = -(ushort)(auVar73._6_2_ == -1);
                auVar69._8_2_ = -(ushort)(auVar73._8_2_ == -1);
                auVar69._10_2_ = -(ushort)(auVar73._10_2_ == -1);
                auVar69._12_2_ = -(ushort)(auVar73._12_2_ == -1);
                auVar69._14_2_ = -(ushort)(auVar73._14_2_ == -1);
                auVar62 = local_1d8 & auVar69 | ~auVar69 & auVar75;
                sVar3 = auVar62._0_2_;
                sVar55 = auVar62._2_2_;
                sVar60 = auVar62._4_2_;
                sVar6 = auVar62._6_2_;
                sVar7 = auVar62._8_2_;
                sVar9 = auVar62._10_2_;
                sVar11 = auVar62._12_2_;
                sVar13 = auVar62._14_2_;
                if (7 < uVar33) {
                  bVar42 = sVar3 < (short)local_178;
                  uVar43 = (ushort)!bVar42 * (short)local_178;
                  bVar4 = sVar55 < local_178._2_2_;
                  uVar48 = (ushort)!bVar4 * local_178._2_2_;
                  bVar5 = sVar60 < local_178._4_2_;
                  uVar49 = (ushort)!bVar5 * local_178._4_2_;
                  bVar8 = sVar7 < (short)uStack_170;
                  uVar50 = (ushort)!bVar8 * (short)uStack_170;
                  bVar10 = sVar9 < uStack_170._2_2_;
                  uVar51 = (ushort)!bVar10 * uStack_170._2_2_;
                  bVar12 = sVar11 < uStack_170._4_2_;
                  uVar52 = (ushort)!bVar12 * uStack_170._4_2_;
                  local_178 = CONCAT26((ushort)(sVar6 < local_178._6_2_) * sVar6 |
                                       (ushort)(sVar6 >= local_178._6_2_) * local_178._6_2_,
                                       CONCAT24((ushort)bVar5 * sVar60 | uVar49,
                                                CONCAT22((ushort)bVar4 * sVar55 | uVar48,
                                                         (ushort)bVar42 * sVar3 | uVar43)));
                  uStack_170 = CONCAT26((ushort)(sVar13 < uStack_170._6_2_) * sVar13 |
                                        (ushort)(sVar13 >= uStack_170._6_2_) * uStack_170._6_2_,
                                        CONCAT24((ushort)bVar12 * sVar11 | uVar52,
                                                 CONCAT22((ushort)bVar10 * sVar9 | uVar51,
                                                          (ushort)bVar8 * sVar7 | uVar50)));
                  local_168._2_2_ =
                       (ushort)((short)local_168._2_2_ < sVar55) * sVar55 |
                       (ushort)((short)local_168._2_2_ >= sVar55) * local_168._2_2_;
                  local_168._0_2_ =
                       (ushort)((short)local_168._0_2_ < sVar3) * sVar3 |
                       (ushort)((short)local_168._0_2_ >= sVar3) * local_168._0_2_;
                  local_168._4_2_ =
                       (ushort)((short)local_168._4_2_ < sVar60) * sVar60 |
                       (ushort)((short)local_168._4_2_ >= sVar60) * local_168._4_2_;
                  local_168._6_2_ =
                       (ushort)((short)local_168._6_2_ < sVar6) * sVar6 |
                       (ushort)((short)local_168._6_2_ >= sVar6) * local_168._6_2_;
                  local_168._8_2_ =
                       (ushort)((short)local_168._8_2_ < sVar7) * sVar7 |
                       (ushort)((short)local_168._8_2_ >= sVar7) * local_168._8_2_;
                  local_168._10_2_ =
                       (ushort)((short)local_168._10_2_ < sVar9) * sVar9 |
                       (ushort)((short)local_168._10_2_ >= sVar9) * local_168._10_2_;
                  local_168._12_2_ =
                       (ushort)((short)local_168._12_2_ < sVar11) * sVar11 |
                       (ushort)((short)local_168._12_2_ >= sVar11) * local_168._12_2_;
                  local_168._14_2_ =
                       (ushort)((short)local_168._14_2_ < sVar13) * sVar13 |
                       (ushort)((short)local_168._14_2_ >= sVar13) * local_168._14_2_;
                }
                piVar2 = ((ppVar21->field_4).rowcols)->score_row;
                if (uVar33 < uVar41) {
                  *(int *)((long)piVar2 + uVar33 * 4 + local_198) = (int)sVar13;
                }
                if (uVar33 - 1 < uVar41 && (long)local_1a0 < lVar30) {
                  *(int *)((long)piVar2 + uVar33 * 4 + lVar22 * local_1a0 + -4) = (int)sVar11;
                }
                if (((long)local_1a8 < lVar30) && ((long)(uVar33 - 2) < (long)uVar41 && 1 < uVar33))
                {
                  *(int *)((long)piVar2 + uVar33 * 4 + lVar22 * local_1a8 + -8) = (int)sVar9;
                }
                if (((long)local_1b0 < lVar30) && ((long)(uVar33 - 3) < (long)uVar41 && 2 < uVar33))
                {
                  *(int *)((long)piVar2 + uVar33 * 4 + lVar22 * local_1b0 + -0xc) = (int)sVar7;
                }
                if (((long)local_1b8 < lVar30) && ((long)(uVar33 - 4) < (long)uVar41 && 3 < uVar33))
                {
                  *(int *)((long)piVar2 + uVar33 * 4 + lVar22 * local_1b8 + -0x10) = (int)sVar6;
                }
                if (((long)local_1c0 < lVar30) && ((long)(uVar33 - 5) < (long)uVar41 && 4 < uVar33))
                {
                  *(int *)((long)piVar2 + uVar33 * 4 + lVar22 * local_1c0 + -0x14) = (int)sVar60;
                }
                if (((long)local_1c8 < lVar30) && ((long)(uVar33 - 6) < (long)uVar41 && 5 < uVar33))
                {
                  *(int *)((long)piVar2 + uVar33 * 4 + lVar22 * local_1c8 + -0x18) = (int)sVar55;
                }
                if (6 < uVar33 && (long)uVar40 < lVar30) {
                  *(int *)((long)piVar2 + uVar33 * 4 + lVar22 * uVar40 + -0x1c) = (int)sVar3;
                }
                auVar16._4_2_ = local_238;
                auVar16._0_4_ = uVar63;
                auVar16._6_2_ = sStack_236;
                auVar16._8_2_ = local_238;
                auVar16._10_2_ = sStack_236;
                auVar16._12_2_ = local_238;
                auVar16._14_2_ = sStack_236;
                auVar64 = ~auVar69 & auVar72 | auVar16 & auVar69;
                auVar70 = ~auVar69 & auVar58 | auVar16 & auVar69;
                ptr_00[uVar33] = sVar3;
                ptr_01[uVar33] = auVar64._0_2_;
                local_78 = auVar47._0_2_;
                sStack_76 = auVar47._2_2_;
                sStack_74 = auVar47._4_2_;
                sStack_72 = auVar47._6_2_;
                sStack_70 = auVar47._8_2_;
                sStack_6e = auVar47._10_2_;
                sStack_6c = auVar47._12_2_;
                sStack_6a = auVar47._14_2_;
                auVar66._0_2_ = -(ushort)(auVar73._0_2_ == local_78);
                auVar66._2_2_ = -(ushort)(auVar73._2_2_ == sStack_76);
                auVar66._4_2_ = -(ushort)(auVar73._4_2_ == sStack_74);
                auVar66._6_2_ = -(ushort)(auVar73._6_2_ == sStack_72);
                auVar66._8_2_ = -(ushort)(auVar73._8_2_ == sStack_70);
                auVar66._10_2_ = -(ushort)(auVar73._10_2_ == sStack_6e);
                auVar66._12_2_ = -(ushort)(auVar73._12_2_ == sStack_6c);
                auVar66._14_2_ = -(ushort)(auVar73._14_2_ == sStack_6a);
                auVar18._2_2_ = -(ushort)(auVar59._2_2_ == sStack_96);
                auVar18._0_2_ = -(ushort)(auVar59._0_2_ == local_98);
                auVar18._4_2_ = -(ushort)(auVar59._4_2_ == sStack_94);
                auVar18._6_2_ = -(ushort)(auVar59._6_2_ == sStack_92);
                auVar18._8_2_ = -(ushort)(auVar59._8_2_ == sStack_90);
                auVar18._10_2_ = -(ushort)(auVar59._10_2_ == sStack_8e);
                auVar18._12_2_ = -(ushort)(auVar59._12_2_ == sStack_8c);
                auVar18._14_2_ = -(ushort)(auVar59._14_2_ == sStack_8a);
                auVar67 = ~(auVar66 & auVar18) & auVar67 | auVar62 & auVar66 & auVar18;
                auVar73 = paddsw(auVar73,_DAT_008a1ba0);
                auVar76 = auVar74;
              }
              auVar59 = paddsw(auVar59,_DAT_008a1bb0);
              local_1d8 = psubsw(local_1d8,auVar57);
              local_198 = local_198 + uVar41 * 0x20;
            }
            iVar20 = 8;
            while( true ) {
              sVar61 = (short)uVar38;
              bVar42 = iVar20 == 0;
              iVar20 = iVar20 + -1;
              if (bVar42) break;
              uVar41 = auVar67._0_8_;
              lVar30 = auVar67._8_8_;
              uVar36 = (uint)auVar67._14_2_;
              if ((short)auVar67._14_2_ <= sVar61) {
                uVar36 = uVar38;
              }
              uVar38 = uVar36;
              auVar67._0_8_ = uVar41 << 0x10;
              auVar67._8_8_ = lVar30 << 0x10 | uVar41 >> 0x30;
            }
            auVar59._0_2_ = -(ushort)((short)local_178 < local_238);
            auVar59._2_2_ = -(ushort)(local_178._2_2_ < sStack_236);
            auVar59._4_2_ = -(ushort)(local_178._4_2_ < local_238);
            auVar59._6_2_ = -(ushort)(local_178._6_2_ < sStack_236);
            auVar59._8_2_ = -(ushort)((short)uStack_170 < local_238);
            auVar59._10_2_ = -(ushort)(uStack_170._2_2_ < sStack_236);
            auVar59._12_2_ = -(ushort)(uStack_170._4_2_ < local_238);
            auVar59._14_2_ = -(ushort)(uStack_170._6_2_ < sStack_236);
            local_c8 = auVar46._0_2_;
            sStack_c6 = auVar46._2_2_;
            auVar46._0_2_ = -(ushort)(local_c8 < (short)local_168._0_2_);
            auVar46._2_2_ = -(ushort)(sStack_c6 < (short)local_168._2_2_);
            auVar46._4_2_ = -(ushort)(local_c8 < (short)local_168._4_2_);
            auVar46._6_2_ = -(ushort)(sStack_c6 < (short)local_168._6_2_);
            auVar46._8_2_ = -(ushort)(local_c8 < (short)local_168._8_2_);
            auVar46._10_2_ = -(ushort)(sStack_c6 < (short)local_168._10_2_);
            auVar46._12_2_ = -(ushort)(local_c8 < (short)local_168._12_2_);
            auVar46._14_2_ = -(ushort)(sStack_c6 < (short)local_168._14_2_);
            auVar46 = auVar46 | auVar59;
            if ((((((((((((((((auVar46 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                             (auVar46 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar46 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar46 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar46 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar46 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar46 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar46 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar46 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar46 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar46 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar46 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar46 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar46 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar46 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar46[0xf] < '\0') {
              *(byte *)&ppVar21->flag = (byte)ppVar21->flag | 0x40;
              sVar61 = 0;
              iVar28 = 0;
              local_248 = 0;
            }
            ppVar21->score = (int)sVar61;
            ppVar21->end_query = local_248;
            ppVar21->end_ref = iVar28;
            parasail_free(ptr_01);
            parasail_free(ptr_00);
            parasail_free(ptr);
            if (matrix->type == 0) {
              parasail_free(local_220);
              return ppVar21;
            }
            return ppVar21;
          }
        }
        return (parasail_result_t *)0x0;
      }
      if (_s1 == (char *)0x0) {
        __format = "%s: missing %s\n";
        pcVar27 = "_s1";
      }
      else {
        uVar26 = (ulong)(uint)_s1Len;
        if (0 < _s1Len) goto LAB_00559b86;
        __format = "%s: %s must be > 0\n";
        pcVar27 = "_s1Len";
      }
    }
  }
  fprintf(_stderr,__format,"parasail_nw_table_diag_sse2_128_16",pcVar27);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int16_t * restrict s1 = NULL;
    int16_t * restrict s2B = NULL;
    int16_t * restrict _H_pr = NULL;
    int16_t * restrict _F_pr = NULL;
    int16_t * restrict s2 = NULL;
    int16_t * restrict H_pr = NULL;
    int16_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    int16_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInf;
    __m128i vOpen;
    __m128i vGap;
    __m128i vOne;
    __m128i vN;
    __m128i vGapN;
    __m128i vNegOne;
    __m128i vI;
    __m128i vJreset;
    __m128i vMax;
    __m128i vILimit;
    __m128i vILimit1;
    __m128i vJLimit;
    __m128i vJLimit1;
    __m128i vIBoundary;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 8; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm_set1_epi16(NEG_LIMIT);
    vOpen = _mm_set1_epi16(open);
    vGap  = _mm_set1_epi16(gap);
    vOne = _mm_set1_epi16(1);
    vN = _mm_set1_epi16(N);
    vGapN = _mm_set1_epi16(gap*N);
    vNegOne = _mm_set1_epi16(-1);
    vI = _mm_set_epi16(0,1,2,3,4,5,6,7);
    vJreset = _mm_set_epi16(0,-1,-2,-3,-4,-5,-6,-7);
    vMax = vNegInf;
    vILimit = _mm_set1_epi16(s1Len);
    vILimit1 = _mm_subs_epi16(vILimit, vOne);
    vJLimit = _mm_set1_epi16(s2Len);
    vJLimit1 = _mm_subs_epi16(vJLimit, vOne);
    vIBoundary = _mm_set_epi16(
            -open-0*gap,
            -open-1*gap,
            -open-2*gap,
            -open-3*gap,
            -open-4*gap,
            -open-5*gap,
            -open-6*gap,
            -open-7*gap);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int16_t(16, s2Len+PAD2);
    _H_pr = parasail_memalign_int16_t(16, s2Len+PAD2);
    _F_pr = parasail_memalign_int16_t(16, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int16_t(16, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = -open - j*gap;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    H_pr[-1] = 0; /* upper left corner */

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m128i vNH = vNegInf;
        __m128i vWH = vNegInf;
        __m128i vE = vNegInf;
        __m128i vF = vNegInf;
        __m128i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        const int * const restrict matrow4 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+4] : ((i+4 >= s1Len) ? s1Len-1 : i+4))];
        const int * const restrict matrow5 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+5] : ((i+5 >= s1Len) ? s1Len-1 : i+5))];
        const int * const restrict matrow6 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+6] : ((i+6 >= s1Len) ? s1Len-1 : i+6))];
        const int * const restrict matrow7 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+7] : ((i+7 >= s1Len) ? s1Len-1 : i+7))];
        vNH = _mm_srli_si128(vNH, 2);
        vNH = _mm_insert_epi16(vNH, H_pr[-1], 7);
        vWH = _mm_srli_si128(vWH, 2);
        vWH = _mm_insert_epi16(vWH, -open - i*gap, 7);
        H_pr[-1] = -open - (i+N)*gap;
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m128i vMat;
            __m128i vNWH = vNH;
            vNH = _mm_srli_si128(vWH, 2);
            vNH = _mm_insert_epi16(vNH, H_pr[j], 7);
            vF = _mm_srli_si128(vF, 2);
            vF = _mm_insert_epi16(vF, F_pr[j], 7);
            vF = _mm_max_epi16(
                    _mm_subs_epi16(vNH, vOpen),
                    _mm_subs_epi16(vF, vGap));
            vE = _mm_max_epi16(
                    _mm_subs_epi16(vWH, vOpen),
                    _mm_subs_epi16(vE, vGap));
            vMat = _mm_set_epi16(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]],
                    matrow4[s2[j-4]],
                    matrow5[s2[j-5]],
                    matrow6[s2[j-6]],
                    matrow7[s2[j-7]]
                    );
            vNWH = _mm_adds_epi16(vNWH, vMat);
            vWH = _mm_max_epi16(vNWH, vE);
            vWH = _mm_max_epi16(vWH, vF);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m128i cond = _mm_cmpeq_epi16(vJ,vNegOne);
                vWH = _mm_blendv_epi8_rpl(vWH, vIBoundary, cond);
                vF = _mm_blendv_epi8_rpl(vF, vNegInf, cond);
                vE = _mm_blendv_epi8_rpl(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-7] = (int16_t)_mm_extract_epi16(vWH,0);
            F_pr[j-7] = (int16_t)_mm_extract_epi16(vF,0);
            /* as minor diagonal vector passes across table, extract
               last table value at the i,j bound */
            {
                __m128i cond_valid_I = _mm_cmpeq_epi16(vI, vILimit1);
                __m128i cond_valid_J = _mm_cmpeq_epi16(vJ, vJLimit1);
                __m128i cond_all = _mm_and_si128(cond_valid_I, cond_valid_J);
                vMax = _mm_blendv_epi8_rpl(vMax, vWH, cond_all);
            }
            vJ = _mm_adds_epi16(vJ, vOne);
        }
        vI = _mm_adds_epi16(vI, vN);
        vIBoundary = _mm_subs_epi16(vIBoundary, vGapN);
    }

    /* max in vMax */
    for (i=0; i<N; ++i) {
        int16_t value;
        value = (int16_t) _mm_extract_epi16(vMax, 7);
        if (value > score) {
            score = value;
        }
        vMax = _mm_slli_si128(vMax, 2);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}